

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O1

void __thiscall Perseus::PlanLeadOut(Perseus *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  pointer pcVar3;
  ostream *poVar4;
  PlanningUnit *pu;
  stringstream ss;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [7];
  ios_base local_128 [264];
  
  p_Var2 = this->_vptr_Perseus[-3];
  pcVar3 = (this->_m_identification)._M_dataplus._M_p;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var2),(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  if (this->_m_storeTimings == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"POMDP","");
    pu = *(PlanningUnit **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
    if (pu == (PlanningUnit *)0x0) {
      pu = *(PlanningUnit **)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
    }
    directories::MADPGetResultsDir(&local_208,&local_1c8,pu);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1a8 + 0x10),local_208._M_dataplus._M_p,
                        local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
    pcVar3 = (this->_m_identification)._M_dataplus._M_p;
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1e8,local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Timings_h",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = this->_vptr_Perseus[-3];
    std::__cxx11::stringbuf::str();
    TimedAlgorithm::SaveTimers
              ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var2),&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (0 < this->_m_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Saved timing results to ",0x18);
      std::__cxx11::stringbuf::str();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_208._M_dataplus._M_p,
                          local_208._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void Perseus::PlanLeadOut()
{
    StopTimer(GetIdentification());
    if(_m_storeTimings)
    {
        stringstream ss;
        ss << directories::MADPGetResultsDir("POMDP",GetPU()) << "/"
           << GetIdentification() << "Timings_h" << GetPU()->GetHorizon();
        SaveTimers(ss.str());
        if(GetVerbose() >= 1)
            cout << "Saved timing results to " << ss.str() << endl;
    }
}